

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * fts5ExprPrint(Fts5Config *pConfig,Fts5ExprNode *pExpr)

{
  Fts5ExprTerm *pFVar1;
  uint uVar2;
  Fts5ExprNearset *pFVar3;
  Fts5ExprPhrase *pFVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  void *p;
  char *pcVar9;
  Fts5ExprTerm *pFVar10;
  char *pcVar11;
  char *zOp;
  char *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  char cVar17;
  char *pcVar18;
  u64 n;
  char *local_48;
  
  switch(pExpr->eType) {
  case 0:
    pcVar12 = sqlite3_mprintf("\"\"");
    return pcVar12;
  default:
    pcVar12 = " OR ";
    break;
  case 2:
    pcVar12 = " AND ";
    break;
  case 3:
    pcVar12 = " NOT ";
    break;
  case 4:
  case 9:
    pFVar3 = pExpr->pNear;
    if (pFVar3->pColset == (Fts5Colset *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar12 = fts5PrintfAppend((char *)0x0,"%s : ",pConfig->azCol[pFVar3->pColset->aiCol[0]]);
      if (pcVar12 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if ((pFVar3->nPhrase < 2) ||
       (pcVar12 = fts5PrintfAppend(pcVar12,"NEAR("), pcVar12 != (char *)0x0)) {
      if (0 < pFVar3->nPhrase) {
        lVar14 = 0;
LAB_001aeac0:
        pFVar4 = pFVar3->apPhrase[lVar14];
        if (lVar14 == 0) {
LAB_001aeaea:
          bVar5 = true;
          if (0 < pFVar4->nTerm) {
            lVar13 = 0;
LAB_001aeb02:
            pFVar1 = pFVar4->aTerm + lVar13;
            sVar8 = strlen(pFVar4->aTerm[lVar13].zTerm);
            n = 0;
            pFVar10 = pFVar1;
            do {
              n = n + (long)((int)sVar8 * 2 + 5);
              pFVar10 = pFVar10->pSynonym;
            } while (pFVar10 != (Fts5ExprTerm *)0x0);
            iVar6 = sqlite3_initialize();
            if (iVar6 == 0) {
              p = sqlite3Malloc(n);
            }
            else {
              p = (void *)0x0;
            }
            if (p != (void *)0x0) {
              iVar6 = 0;
              pFVar10 = pFVar1;
LAB_001aeb59:
              pcVar7 = pFVar10->zTerm;
              cVar17 = '\"';
              do {
                lVar15 = (long)iVar6;
                *(char *)((long)p + lVar15) = cVar17;
                uVar16 = lVar15 + 1;
                if (*pcVar7 == '\"') {
                  *(undefined1 *)((long)p + uVar16) = 0x22;
                  uVar16 = (ulong)(iVar6 + 2);
                }
                else if (*pcVar7 == '\0') goto LAB_001aeb92;
                cVar17 = *pcVar7;
                pcVar7 = pcVar7 + 1;
                iVar6 = (int)uVar16;
              } while( true );
            }
            goto LAB_001aec0e;
          }
        }
        else {
          bVar5 = false;
          pcVar12 = fts5PrintfAppend(pcVar12," ");
          if (pcVar12 != (char *)0x0) goto LAB_001aeaea;
          pcVar12 = (char *)0x0;
        }
        goto LAB_001aec51;
      }
      bVar5 = false;
      goto LAB_001aec7a;
    }
    goto LAB_001aec6e;
  }
  if (pExpr->nChild < 1) {
LAB_001aec6e:
    local_48 = (char *)0x0;
  }
  else {
    lVar14 = 0;
    local_48 = (char *)0x0;
    do {
      pcVar7 = fts5ExprPrint(pConfig,pExpr->apChild[lVar14]);
      if (pcVar7 == (char *)0x0) {
        sqlite3_free(local_48);
        local_48 = (char *)0x0;
      }
      else {
        uVar2 = pExpr->apChild[lVar14]->eType;
        pcVar11 = pcVar12;
        if (lVar14 == 0) {
          pcVar11 = "";
        }
        bVar5 = (0x1eeU >> ((byte)uVar2 & 0x1f) & 1) != 0;
        pcVar9 = "";
        if (bVar5 || 9 < uVar2) {
          pcVar9 = "(";
        }
        pcVar18 = "";
        if (bVar5 || 9 < uVar2) {
          pcVar18 = ")";
        }
        local_48 = fts5PrintfAppend(local_48,"%s%s%z%s",pcVar11,pcVar9,pcVar7,pcVar18);
      }
    } while ((local_48 != (char *)0x0) && (lVar14 = lVar14 + 1, lVar14 < pExpr->nChild));
  }
  return local_48;
LAB_001aeb92:
  *(undefined1 *)((long)p + uVar16) = 0x22;
  if (pFVar10->pSynonym == (Fts5ExprTerm *)0x0) {
    iVar6 = (int)(lVar15 + 2);
  }
  else {
    iVar6 = iVar6 + 3;
    *(undefined1 *)((long)p + lVar15 + 2) = 0x7c;
  }
  pFVar10 = pFVar10->pSynonym;
  if (pFVar10 == (Fts5ExprTerm *)0x0) goto code_r0x001aebb9;
  goto LAB_001aeb59;
code_r0x001aebb9:
  if (pFVar1->bPrefix != '\0') {
    *(undefined2 *)((long)p + (long)iVar6) = 0x2a20;
    iVar6 = iVar6 + 2;
  }
  *(undefined1 *)((long)p + (long)iVar6) = 0;
  if (p != (void *)0x0) {
    pcVar7 = " + ";
    if (lVar13 == 0) {
      pcVar7 = "";
    }
    pcVar12 = fts5PrintfAppend(pcVar12,"%s%s",pcVar7,p);
    sqlite3_free(p);
  }
LAB_001aec0e:
  if ((p == (void *)0x0) || (pcVar12 == (char *)0x0)) {
    sqlite3_free(pcVar12);
    bVar5 = false;
    goto LAB_001aec51;
  }
  lVar13 = lVar13 + 1;
  if (pFVar4->nTerm <= lVar13) goto code_r0x001aec28;
  goto LAB_001aeb02;
code_r0x001aec28:
  bVar5 = true;
LAB_001aec51:
  if (!bVar5) {
    return (char *)0x0;
  }
  lVar14 = lVar14 + 1;
  if (pFVar3->nPhrase <= lVar14) goto code_r0x001aec66;
  goto LAB_001aeac0;
code_r0x001aec66:
  bVar5 = 1 < pFVar3->nPhrase;
LAB_001aec7a:
  if (!bVar5) {
    return pcVar12;
  }
  pcVar12 = fts5PrintfAppend(pcVar12,", %d)",(ulong)(uint)pFVar3->nNear);
  return pcVar12;
}

Assistant:

static char *fts5ExprPrint(Fts5Config *pConfig, Fts5ExprNode *pExpr){
  char *zRet = 0;
  if( pExpr->eType==0 ){
    return sqlite3_mprintf("\"\"");
  }else
  if( pExpr->eType==FTS5_STRING || pExpr->eType==FTS5_TERM ){
    Fts5ExprNearset *pNear = pExpr->pNear;
    int i; 
    int iTerm;

    if( pNear->pColset ){
      int iCol = pNear->pColset->aiCol[0];
      zRet = fts5PrintfAppend(zRet, "%s : ", pConfig->azCol[iCol]);
      if( zRet==0 ) return 0;
    }

    if( pNear->nPhrase>1 ){
      zRet = fts5PrintfAppend(zRet, "NEAR(");
      if( zRet==0 ) return 0;
    }

    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      if( i!=0 ){
        zRet = fts5PrintfAppend(zRet, " ");
        if( zRet==0 ) return 0;
      }
      for(iTerm=0; iTerm<pPhrase->nTerm; iTerm++){
        char *zTerm = fts5ExprTermPrint(&pPhrase->aTerm[iTerm]);
        if( zTerm ){
          zRet = fts5PrintfAppend(zRet, "%s%s", iTerm==0?"":" + ", zTerm);
          sqlite3_free(zTerm);
        }
        if( zTerm==0 || zRet==0 ){
          sqlite3_free(zRet);
          return 0;
        }
      }
    }

    if( pNear->nPhrase>1 ){
      zRet = fts5PrintfAppend(zRet, ", %d)", pNear->nNear);
      if( zRet==0 ) return 0;
    }

  }else{
    char const *zOp = 0;
    int i;

    switch( pExpr->eType ){
      case FTS5_AND: zOp = " AND "; break;
      case FTS5_NOT: zOp = " NOT "; break;
      default:  
        assert( pExpr->eType==FTS5_OR );
        zOp = " OR "; 
        break;
    }

    for(i=0; i<pExpr->nChild; i++){
      char *z = fts5ExprPrint(pConfig, pExpr->apChild[i]);
      if( z==0 ){
        sqlite3_free(zRet);
        zRet = 0;
      }else{
        int e = pExpr->apChild[i]->eType;
        int b = (e!=FTS5_STRING && e!=FTS5_TERM && e!=FTS5_EOF);
        zRet = fts5PrintfAppend(zRet, "%s%s%z%s", 
            (i==0 ? "" : zOp),
            (b?"(":""), z, (b?")":"")
        );
      }
      if( zRet==0 ) break;
    }
  }

  return zRet;
}